

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

int isFrameExtentsEvent(Display *display,XEvent *event,XPointer pointer)

{
  bool local_29;
  _GLFWwindow *window;
  XPointer pointer_local;
  XEvent *event_local;
  Display *display_local;
  
  local_29 = false;
  if (((event->type == 0x1c) && (local_29 = false, (event->xexpose).count == 0)) &&
     (local_29 = false, (event->xany).window == *(Window *)(pointer + 0x360))) {
    local_29 = (event->xkey).root == _glfw.x11.NET_FRAME_EXTENTS;
  }
  return (int)local_29;
}

Assistant:

static Bool isFrameExtentsEvent(Display* display, XEvent* event, XPointer pointer)
{
    _GLFWwindow* window = (_GLFWwindow*) pointer;
    return event->type == PropertyNotify &&
           event->xproperty.state == PropertyNewValue &&
           event->xproperty.window == window->x11.handle &&
           event->xproperty.atom == _glfw.x11.NET_FRAME_EXTENTS;
}